

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

Model * addOptionalField(Model *model,string *name)

{
  ModelDescription *this;
  FeatureDescription *this_00;
  Arena *pAVar1;
  FeatureType *pFVar2;
  FeatureDescription *input;
  string *name_local;
  Model *model_local;
  
  this = CoreML::Specification::Model::mutable_description(model);
  this_00 = CoreML::Specification::ModelDescription::add_input(this);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this_00->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&this_00->name_,name,pAVar1);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this_00);
  CoreML::Specification::FeatureType::mutable_int64type(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this_00);
  CoreML::Specification::FeatureType::set_isoptional(pFVar2,true);
  return model;
}

Assistant:

static Specification::Model& addOptionalField(Specification::Model& model, const std::string& name) {
    auto *input = model.mutable_description()->add_input();
    input->set_name(name);
    input->mutable_type()->mutable_int64type();
    input->mutable_type()->set_isoptional(true);
    return model;
}